

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VanEmdeBoasTree.cpp
# Opt level: O1

bool __thiscall VanEmdeBoasTree::predecessor(VanEmdeBoasTree *this,Node *root,int value,int *result)

{
  Node *root_00;
  bool bVar1;
  int iVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  int j;
  int i;
  int local_34;
  int local_30;
  float local_2c;
  
  if ((value < 0 || root == (Node *)0x0) || (root->uni < value)) goto LAB_00108509;
  if (root->max < value) {
    *result = root->max;
LAB_00108672:
    bVar1 = true;
  }
  else {
    if (root->summary == (Node *)0x0) {
LAB_00108664:
      iVar2 = root->min;
      if (iVar2 < value) {
LAB_00108670:
        *result = iVar2;
        goto LAB_00108672;
      }
    }
    else {
      dVar4 = log2((double)root->uni);
      dVar4 = floor(dVar4 * 0.5);
      dVar4 = exp2(dVar4);
      dVar5 = log2((double)root->uni);
      dVar5 = floor(dVar5 * 0.5);
      dVar5 = exp2(dVar5);
      local_30 = (int)((float)value / (float)dVar5);
      local_34 = -0x80000000;
      root_00 = root->cluster[local_30];
      if ((root_00 == (Node *)0x0) || (value % (int)dVar4 <= root_00->min)) {
        bVar1 = predecessor(this,root->summary,local_30,&local_30);
        if (!bVar1) goto LAB_00108664;
        if (root->cluster[local_30] != (Node *)0x0) {
          local_34 = root->cluster[local_30]->max;
          goto LAB_00108613;
        }
      }
      else {
        bVar1 = predecessor(this,root_00,value % (int)dVar4,&local_34);
        if (bVar1) {
LAB_00108613:
          fVar3 = (float)local_30;
          local_2c = (float)local_34;
          dVar4 = log2((double)root->uni);
          dVar4 = floor(dVar4 * 0.5);
          dVar4 = exp2(dVar4);
          iVar2 = (int)((float)dVar4 * fVar3 + local_2c);
          goto LAB_00108670;
        }
      }
    }
LAB_00108509:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool VanEmdeBoasTree::predecessor(Node *root, int value, int &result) {
    if (!root) {
        return false;
    }

    if (value < 0 || value > root->uni) {
        return false;
    }

    if (root->max < value) {
        result = root->max;
        return true;
    }

    if (!root->summary) {
        if (root->min < value) {
            result = root->min;
            return true;
        }
        return false;
    }

    int lowVal = low(root, value);
    int highVal = high(root, value);
    int i = highVal;
    int j = INT_MIN;
    int tmp;
    if (findMin(root->cluster[i], tmp) && lowVal > tmp) {
        if (!predecessor(root->cluster[i], lowVal, j)) {
            return false;
        }
    } else {
        if (!predecessor(root->summary, highVal, i)) {
            if (root->min < value) {
                result = root->min;
                return true;
            }
            return false;
        }
        if (!findMax(root->cluster[i], j)) return false;
    }

    result = index(root, i, j);
    return true;
}